

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_lcall_real_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip1,int shift,int next_eip)

{
  uint32_t uVar1;
  target_ulong tVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uintptr_t unaff_retaddr;
  target_ulong ssp;
  uint local_30;
  uint32_t esp_mask;
  uint32_t esp;
  int new_eip;
  int next_eip_local;
  int shift_local;
  target_ulong new_eip1_local;
  int new_cs_local;
  CPUX86State *env_local;
  
  iVar5 = (int)env->regs[4];
  uVar3 = get_sp_mask(env->segs[2].flags);
  tVar2 = env->segs[2].base;
  if (shift == 0) {
    uVar1 = env->segs[1].selector;
    iVar4 = cpu_mmu_index_kernel(env);
    cpu_stw_mmuidx_ra_x86_64(env,tVar2 + (iVar5 - 2U & uVar3),uVar1,iVar4,unaff_retaddr);
    local_30 = iVar5 - 4;
    iVar5 = cpu_mmu_index_kernel(env);
    cpu_stw_mmuidx_ra_x86_64(env,tVar2 + (local_30 & uVar3),next_eip,iVar5,unaff_retaddr);
  }
  else {
    uVar1 = env->segs[1].selector;
    iVar4 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64
              (env,(ulong)((int)tVar2 + (iVar5 - 4U & uVar3)),uVar1,iVar4,unaff_retaddr);
    local_30 = iVar5 - 8;
    iVar5 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64
              (env,(ulong)((int)tVar2 + (local_30 & uVar3)),next_eip,iVar5,unaff_retaddr);
  }
  if (uVar3 == 0xffff) {
    env->regs[4] = env->regs[4] & 0xffffffffffff0000 | (ulong)(local_30 & 0xffff);
  }
  else if (uVar3 == 0xffffffff) {
    env->regs[4] = (ulong)local_30;
  }
  else {
    env->regs[4] = (ulong)local_30;
  }
  env->eip = (long)(int)new_eip1;
  env->segs[1].selector = new_cs;
  env->segs[1].base = (long)(new_cs << 4);
  return;
}

Assistant:

void helper_lcall_real(CPUX86State *env, int new_cs, target_ulong new_eip1,
                       int shift, int next_eip)
{
    int new_eip;
    uint32_t esp, esp_mask;
    target_ulong ssp;

    new_eip = new_eip1;
    esp = env->regs[R_ESP];
    esp_mask = get_sp_mask(env->segs[R_SS].flags);
    ssp = env->segs[R_SS].base;
    if (shift) {
        PUSHL_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHL_RA(ssp, esp, esp_mask, next_eip, GETPC());
    } else {
        PUSHW_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHW_RA(ssp, esp, esp_mask, next_eip, GETPC());
    }

    SET_ESP(esp, esp_mask);
    env->eip = new_eip;
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
}